

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

bool __thiscall Board::isSolveable(Board *this)

{
  pointer pTVar1;
  bool bVar2;
  uint uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  ulong uVar5;
  undefined8 uStack_28;
  
  uVar3 = 0;
  uStack_28 = in_RAX;
  while( true ) {
    uStack_28 = CONCAT44(uVar3,(undefined4)uStack_28);
    uVar5 = (ulong)uVar3;
    pTVar1 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar1 >> 3;
    if (uVar4 <= uVar5) break;
    if (pTVar1[uVar5].status != Empty) {
      bVar2 = isTileInsertionValid(this,(tile_index *)((long)&uStack_28 + 4));
      if (!bVar2) break;
      uVar3 = uStack_28._4_4_;
    }
    uVar3 = uVar3 + 1;
  }
  return uVar4 <= uVar5;
}

Assistant:

const bool Board::isSolveable() const
{
	for (unsigned int i = 0; i < _tiles.size(); i++)
	{
		if (_tiles[i].status != TileStatus::Empty && !isTileInsertionValid(i))
			return false;
	}

	return true;
}